

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-moduled-compress.c
# Opt level: O0

void KosinskiCompressModuled
               (size_t file_size,KosinskiCompressCallbacks *callbacks,cc_bool print_debug_messages)

{
  undefined1 local_58 [8];
  KosinskiCompressCallbacks new_callbacks;
  CallbacksAndCounter callbacks_and_counter;
  size_t file_index;
  cc_bool print_debug_messages_local;
  KosinskiCompressCallbacks *callbacks_local;
  size_t file_size_local;
  
  if ((file_size < 0x10000) && (file_size != 0xa000)) {
    (*callbacks->write_byte)(callbacks->write_byte_user_data,(uint)(file_size >> 8));
    (*callbacks->write_byte)(callbacks->write_byte_user_data,(uint)file_size & 0xff);
    local_58 = (undefined1  [8])&new_callbacks.write_byte;
    new_callbacks.read_byte_user_data = ReadByte;
    new_callbacks.read_byte = (_func_uint_void_ptr *)callbacks->write_byte_user_data;
    new_callbacks.write_byte_user_data = callbacks->write_byte;
    callbacks_and_counter.bytes_remaining = 0;
    callbacks_and_counter._12_4_ = 0;
    new_callbacks.write_byte = (_func_void_void_ptr_uint *)callbacks;
    for (; (ulong)callbacks_and_counter._8_8_ < file_size;
        callbacks_and_counter._8_8_ = callbacks_and_counter._8_8_ + 0x1000) {
      KosinskiCompress((KosinskiCompressCallbacks *)local_58,print_debug_messages);
    }
  }
  return;
}

Assistant:

void KosinskiCompressModuled(const size_t file_size, const KosinskiCompressCallbacks* const callbacks, const cc_bool print_debug_messages)
{
	size_t file_index;

	if (file_size > 0xFFFF || file_size == 0xA000) /* For some reason, 0xA000 is forced to 0x8000 in Sonic 3 & Knuckles' `Process_Kos_Module_Queue_Init` function. */
		return;	/* Cannot fit size of file in header - give up */ /* TODO: Error code? */

	callbacks->write_byte((void*)callbacks->write_byte_user_data, file_size >> 8);
	callbacks->write_byte((void*)callbacks->write_byte_user_data, file_size & 0xFF);

	CallbacksAndCounter callbacks_and_counter;
	callbacks_and_counter.callbacks = callbacks;

	KosinskiCompressCallbacks new_callbacks;
	new_callbacks.read_byte_user_data = &callbacks_and_counter;
	new_callbacks.read_byte = ReadByte;
	new_callbacks.write_byte_user_data = callbacks->write_byte_user_data;
	new_callbacks.write_byte = callbacks->write_byte;

	for (file_index = 0; file_index < file_size; file_index += MODULE_SIZE)
	{
		callbacks_and_counter.bytes_remaining = MODULE_SIZE;
		KosinskiCompress(&new_callbacks, print_debug_messages);
	}
}